

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

Reader * __thiscall xLearn::Solver::create_reader(Solver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  Reader *pRVar3;
  ostream *poVar4;
  char *pcVar5;
  char *__s;
  string str;
  Logger local_8c;
  string local_88;
  char *local_68;
  long local_60;
  char local_58 [16];
  string local_48;
  
  pcVar5 = "memory";
  if (((this->hyper_param_).on_disk & 1U) != 0) {
    pcVar5 = "disk";
  }
  __s = "dmatrix";
  if ((this->hyper_param_).from_file != false) {
    __s = pcVar5;
  }
  local_68 = local_58;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar2);
  if (GetRegistry_xLearn_reader_registry()::registry == '\0') {
    create_reader();
  }
  std::__cxx11::string::string((string *)&local_88,local_68,(allocator *)&local_48);
  pRVar3 = ObjectCreatorRegistry_xLearn_reader_registry::CreateObject
                     ((ObjectCreatorRegistry_xLearn_reader_registry *)
                      GetRegistry_xLearn_reader_registry()::registry,&local_88);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (pRVar3 == (Reader *)0x0) {
    local_8c.severity_ = FATAL;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,"");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"create_reader","");
    poVar4 = Logger::Start(FATAL,&local_88,0x4c,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Cannot create reader: ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_68,local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    Logger::~Logger(&local_8c);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return pRVar3;
}

Assistant:

Reader* Solver::create_reader() {
  Reader* reader;
  std::string str = hyper_param_.from_file ? hyper_param_.on_disk ? "disk" : "memory" : "dmatrix";
  reader = CREATE_READER(str.c_str());
  if (reader == nullptr) {
    LOG(FATAL) << "Cannot create reader: " << str;
  }
  return reader;
}